

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
TempBanIRCCommand::trigger
          (TempBanIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  string_view name;
  string_view name_00;
  char *begin;
  undefined8 uVar1;
  duration<long,_std::ratio<1L,_1L>_> dVar2;
  size_t sVar3;
  char *pcVar4;
  player_search_result pVar5;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> dVar6;
  string banner;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  size_t local_a0;
  jessilib *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  size_t local_70;
  char *local_68;
  rep local_60;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_58;
  
  pcVar4 = nick._M_str;
  local_70 = nick._M_len;
  if (parameters._M_len == 0) {
    Jupiter::IRC::Client::sendNotice
              (source,local_70,pcVar4,0x47,
               "Error: Too Few Parameters. Syntax: TempBan [Duration] <Player> [Reason]");
    return;
  }
  local_60 = pluginInstance.m_defaultTempBanTime.__r;
  local_68 = pcVar4;
  jessilib::
  word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
            (&local_58,(jessilib *)parameters._M_str,parameters._M_str + parameters._M_len," \t","",
             pcVar4);
  begin = local_58.first._M_str;
  sVar3 = local_58.first._M_len;
  name._M_str = local_58.first._M_str;
  name._M_len = local_58.first._M_len;
  local_a0 = local_58.second._M_len;
  local_98 = (jessilib *)local_58.second._M_str;
  pVar5 = findPlayerByPartName(source,channel,name);
  dVar2.__r = local_60;
  if (pVar5.player == (PlayerInfo *)0x0 && pVar5.server != (Server *)0x0) {
    if (local_58.second._M_len != 0) {
      dVar6 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (begin,(char *)(sVar3 + (long)begin));
      dVar2 = dVar6.duration.__r;
      if (0 < dVar2.__r) {
        jessilib::
        word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
                  ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)&local_90,(jessilib *)local_58.second._M_str,
                   (char *)(local_58.second._M_str + local_58.second._M_len)," \t","",pcVar4);
        local_58.first._M_len = (size_t)local_90._M_dataplus._M_p;
        local_58.first._M_str = (char *)local_90._M_string_length;
        local_58.second._M_len = local_90.field_2._M_allocated_capacity;
        local_58.second._M_str = (char *)local_90.field_2._8_8_;
        if (pluginInstance.m_maxTempBanTime.__r < dVar2.__r) {
          dVar2.__r = pluginInstance.m_maxTempBanTime.__r;
        }
        name_00._M_str = (char *)local_90._M_string_length;
        name_00._M_len = (size_t)local_90._M_dataplus._M_p;
        local_a0 = local_90.field_2._M_allocated_capacity;
        local_98 = (jessilib *)local_90.field_2._8_8_;
        pVar5 = findPlayerByPartName(source,channel,name_00);
        goto LAB_0012b4ec;
      }
    }
  }
  else {
LAB_0012b4ec:
    if (pVar5.server == (Server *)0x0) {
      pcVar4 = "Error: Channel not attached to any connected Renegade X servers.";
      uVar1 = 0x40;
      goto LAB_0012b5bc;
    }
    if (pVar5.player != (PlayerInfo *)0x0) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,local_68,local_68 + local_70);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_90,"@IRC");
      if (local_a0 == 0) {
        local_98 = (jessilib *)0x13bb77;
      }
      sVar3 = 9;
      if (local_a0 != 0) {
        sVar3 = local_a0;
      }
      RenX::Server::banPlayer
                (pVar5.server,pVar5.player,local_90._M_string_length,local_90._M_dataplus._M_p,sVar3
                 ,local_98,dVar2.__r);
      Jupiter::IRC::Client::sendMessage(source,channel._M_len,channel._M_str,0xe,"Player banned.");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == &local_90.field_2) {
        return;
      }
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      return;
    }
  }
  pcVar4 = "Error: Could not find player.";
  uVar1 = 0x1d;
LAB_0012b5bc:
  Jupiter::IRC::Client::sendMessage(source,channel._M_len,channel._M_str,uVar1,pcVar4);
  return;
}

Assistant:

void TempBanIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (parameters.empty()) {
		source->sendNotice(nick, "Error: Too Few Parameters. Syntax: TempBan [Duration] <Player> [Reason]"sv);
		return;
	}

	std::chrono::seconds duration = pluginInstance.getDefaultTBanTime();
	auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	std::string_view name = command_split.first;
	std::string_view reason = command_split.second;

	// Try searching by name first
	auto search_result = findPlayerByPartName(source, channel, name);
	if (search_result.server != nullptr
		&& search_result.player == nullptr
		&& !command_split.second.empty()) {
		// Try reading token as a duration instead, and search the name token if duration > 0
		duration = jessilib::duration_from_string(name.data(), name.data() + name.size()).duration;
		if (duration.count() > 0) {
			// It reads as a duration; sanity check & try searching again
			command_split = jessilib::word_split_once_view(command_split.second, WHITESPACE_SV);
			duration = std::min(duration, pluginInstance.getMaxTBanTime());
			name = command_split.first;
			reason = command_split.second;
			search_result = findPlayerByPartName(source, channel, name);
		}
	}

	if (search_result.server == nullptr) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	if (search_result.player == nullptr) {
		source->sendMessage(channel, "Error: Could not find player."sv);
		return;
	}

	if (reason.empty()) {
		reason = "No reason"sv;
	}

	std::string banner{ nick };
	banner += "@IRC";
	search_result.server->banPlayer(*search_result.player, banner, reason, duration);
	source->sendMessage(channel, "Player banned."sv);
}